

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveIn * __thiscall
chrono::ChArchiveIn::operator>>(ChArchiveIn *this,ChNameValue<double> *bVal)

{
  ChNameValue<double> local_30;
  ChNameValue<double> *local_18;
  ChNameValue<double> *bVal_local;
  ChArchiveIn *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<double> *)this;
  ChNameValue<double>::ChNameValue(&local_30,bVal);
  (**(code **)(*(long *)this + 0x20))(this,&local_30);
  ChNameValue<double>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveIn& operator>>(ChNameValue<T> bVal) {
          this->in(bVal);
          return (*this);
      }